

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3D.h
# Opt level: O0

Vector3D * CMU462::cross(Vector3D *__return_storage_ptr__,Vector3D *u,Vector3D *v)

{
  Vector3D *v_local;
  Vector3D *u_local;
  
  Vector3D::Vector3D(__return_storage_ptr__,u->y * v->z + -(u->z * v->y),
                     u->z * v->x + -(u->x * v->z),u->x * v->y + -(u->y * v->x));
  return __return_storage_ptr__;
}

Assistant:

inline Vector3D cross( const Vector3D& u, const Vector3D& v ) {
  return Vector3D( u.y*v.z - u.z*v.y,
                   u.z*v.x - u.x*v.z,
                   u.x*v.y - u.y*v.x );
}